

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonRemoveAllNulls(JsonNode *pNode)

{
  JsonNode *pNode_00;
  u32 uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = pNode->n;
  if (1 < (int)uVar1) {
    iVar3 = 2;
    do {
      pNode_00 = pNode + iVar3;
      if (pNode[iVar3].eType == '\a') {
        jsonRemoveAllNulls(pNode_00);
      }
      else if (pNode[iVar3].eType == '\0') {
        pNode_00->jnFlags = pNode_00->jnFlags | 4;
      }
      iVar2 = 2;
      if (5 < pNode_00->eType) {
        iVar2 = pNode_00->n + 2;
      }
      iVar3 = iVar3 + iVar2;
    } while (iVar3 <= (int)uVar1);
  }
  return;
}

Assistant:

static void jsonRemoveAllNulls(JsonNode *pNode){
  int i, n;
  assert( pNode->eType==JSON_OBJECT );
  n = pNode->n;
  for(i=2; i<=n; i += jsonNodeSize(&pNode[i])+1){
    switch( pNode[i].eType ){
      case JSON_NULL:
        pNode[i].jnFlags |= JNODE_REMOVE;
        break;
      case JSON_OBJECT:
        jsonRemoveAllNulls(&pNode[i]);
        break;
    }
  }
}